

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

InvalidSyntaxNode * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::detail::InvalidSyntaxNode,slang::syntax::detail::InvalidSyntaxNode_const&>
          (BumpAllocator *this,InvalidSyntaxNode *args)

{
  InvalidSyntaxNode *pIVar1;
  undefined8 *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pIVar1 = (InvalidSyntaxNode *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  *(undefined8 *)&pIVar1->super_SyntaxNode = *in_RSI;
  (pIVar1->super_SyntaxNode).parent = (SyntaxNode *)in_RSI[1];
  (pIVar1->super_SyntaxNode).previewNode = (SyntaxNode *)in_RSI[2];
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }